

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCollapsingSortedStoragesList.hpp
# Opt level: O3

void __thiscall
supermap::
BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
::append(BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
         *this,unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
               *storage)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  _Var2;
  unsigned_long batchSize;
  long *plVar3;
  element_type *peVar4;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  *psVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  ulong uVar9;
  ListNode *__tmp;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  initializer_list<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>
  __l;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  nextNode;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  curNode;
  allocator_type local_189;
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode>
  *local_168;
  BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  *local_160;
  shared_ptr<supermap::io::FileManager> local_158;
  string local_148;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>_()>
  *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_118;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  local_110;
  undefined **local_d8;
  undefined **local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined8 local_b8;
  long local_b0;
  undefined *local_a8;
  _Any_data local_a0;
  code *local_90;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
  local_80;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  local_48;
  
  local_168 = &this->head_;
  local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_170._M_pi)->_M_use_count = 1;
  (local_170._M_pi)->_M_weak_count = 1;
  (local_170._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00126618;
  local_178 = (element_type *)(local_170._M_pi + 1);
  local_118 = &(this->head_).
               super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  peVar4 = (this->head_).
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var1 = (this->head_).
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar6 = *(undefined4 *)&this->batchSize_;
  uVar7 = *(undefined4 *)((long)&this->batchSize_ + 4);
  local_170._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)
       (storage->_M_t).
       super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
       .
       super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
       ._M_head_impl;
  (storage->_M_t).
  super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
  .
  super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
  ._M_head_impl =
       (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
        *)0x0;
  *(element_type **)&local_170._M_pi[1]._M_use_count = peVar4;
  local_170._M_pi[2]._vptr__Sp_counted_base = (_func_int **)p_Var1;
  local_170._M_pi[2]._M_use_count = uVar6;
  local_170._M_pi[2]._M_weak_count = uVar7;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_178;
  p_Var1 = (this->head_).
           super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->head_).
  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_170._M_pi;
  local_120 = &local_170;
  local_160 = this;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    local_170._M_pi = local_118->_M_pi;
    local_178 = (local_168->
                super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
    if (local_170._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010c5dc;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_170._M_pi)->_M_use_count = (local_170._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_170._M_pi)->_M_use_count = (local_170._M_pi)->_M_use_count + 1;
  }
LAB_0010c5dc:
  local_188 = (local_178->next).
              super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_180._M_pi =
       (local_178->next).
       super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_180._M_pi)->_M_use_count = (local_180._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_180._M_pi)->_M_use_count = (local_180._M_pi)->_M_use_count + 1;
    }
  }
  if (local_188 != (element_type *)0x0) {
    local_128 = &local_160->innerRegisterSupplier_;
    do {
      peVar4 = local_178;
      lVar8 = (**(code **)(*(long *)(local_178->storage)._M_t.
                                    super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                    .
                                    super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                          + 8))();
      uVar9 = ((lVar8 + peVar4->rankOneSize_) - 1) / peVar4->rankOneSize_;
      auVar12._8_4_ = (int)(uVar9 >> 0x20);
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = 0x45300000;
      dVar10 = log2((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      peVar4 = local_188;
      lVar8 = (**(code **)(*(long *)(local_188->storage)._M_t.
                                    super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                                    .
                                    super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                          + 8))();
      uVar9 = ((lVar8 + peVar4->rankOneSize_) - 1) / peVar4->rankOneSize_;
      auVar13._8_4_ = (int)(uVar9 >> 0x20);
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = 0x45300000;
      dVar11 = log2((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      if ((ulong)((long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10) <
          (ulong)((long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11))
      break;
      _Var2.
      super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ._M_head_impl =
           (local_188->storage)._M_t.
           super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           .
           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ;
      local_110.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00126050;
      local_110.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .register_.
      super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
      .
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
      ._vptr_Cloneable =
           (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
            )&PTR_clone_00126080;
      local_110.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .register_.count_ =
           *(unsigned_long *)
            ((long)_Var2.
                   super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                   ._M_head_impl + 0x10);
      (**(code **)**(undefined8 **)
                    ((long)_Var2.
                           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                           ._M_head_impl + 0x18))
                (&local_110.
                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  .
                  super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  .
                  super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                  .register_.innerRegister_);
      local_110.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)
                ((long)_Var2.
                       super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                       ._M_head_impl + 0x20);
      local_110.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((long)_Var2.
                   super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                   ._M_head_impl + 0x28);
      if (local_110.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_110.
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_110.
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                .storageFile_.
                super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_110.
           super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
           .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_110.
                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                .storageFile_.
                super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_110.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR_append_00125f78;
      local_110.
      super_Findable<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::Key<30UL>_>.
      _vptr_Findable = (_func_int **)&DAT_00125fc0;
      _Var2.
      super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ._M_head_impl =
           (local_178->storage)._M_t.
           super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           .
           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ;
      local_d8 = &PTR___cxa_pure_virtual_00126050;
      local_d0 = &PTR_clone_00126080;
      local_c8 = *(undefined8 *)
                  ((long)_Var2.
                         super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                         ._M_head_impl + 0x10);
      (**(code **)**(undefined8 **)
                    ((long)_Var2.
                           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                           ._M_head_impl + 0x18))(local_c0);
      local_b8 = *(undefined8 *)
                  ((long)_Var2.
                         super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                         ._M_head_impl + 0x20);
      local_b0 = *(long *)((long)_Var2.
                                 super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                                 ._M_head_impl + 0x28);
      if (local_b0 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_b0 + 8) = *(int *)(local_b0 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_b0 + 8) = *(int *)(local_b0 + 8) + 1;
        }
      }
      local_d8 = &PTR_append_00125f78;
      local_a8 = &DAT_00125fc0;
      __l._M_len = 2;
      __l._M_array = &local_110;
      std::
      vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ::vector(&local_48,__l,&local_189);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"collapse","");
      lVar8 = *(long *)((long)(local_178->storage)._M_t.
                              super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
                              .
                              super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                       + 0x20);
      local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)(lVar8 + 0x20);
      local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x28);
      if (local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      batchSize = local_160->batchSize_;
      std::
      function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>_()>
      ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>_()>
                  *)&local_a0,local_128);
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>
      ::SortedSingleFileIndexedStorage
                (&local_80,&local_48,&local_148,&local_158,batchSize,
                 (InnerRegisterSupplier *)&local_a0);
      if (local_90 != (code *)0x0) {
        (*local_90)(&local_a0,&local_a0,__destroy_functor);
      }
      if (local_158.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_158.
                   super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
      ::~vector(&local_48);
      lVar8 = 0x38;
      do {
        *(undefined ***)
         ((long)&local_110.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 ._vptr_OrderedStorage + lVar8) = &PTR_append_00125fd8;
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_110.
                          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                          .storageFile_.
                          super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + lVar8);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        *(undefined ***)
         ((long)&local_110.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 ._vptr_OrderedStorage + lVar8) = &PTR___cxa_pure_virtual_00126050;
        *(undefined ***)
         ((long)&local_110.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .register_.
                 super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
         + lVar8) = &PTR_clone_00126080;
        plVar3 = *(long **)((long)&local_110.
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                                   .register_.innerRegister_ + lVar8);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x10))();
        }
        *(undefined8 *)
         ((long)&local_110.
                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .
                 super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                 .register_.innerRegister_ + lVar8) = 0;
        lVar8 = lVar8 + -0x38;
      } while (lVar8 != -0x38);
      _Var2.
      super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ._M_head_impl =
           (local_188->storage)._M_t.
           super___uniq_ptr_impl<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_>_>
           .
           super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
      ;
      (**(code **)(*(long *)_Var2.
                            super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                            ._M_head_impl + 0x28))
                (_Var2.
                 super__Head_base<0UL,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>_*,_false>
                 ._M_head_impl,&local_80);
      (local_168->
      super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = local_188;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_118,&local_180);
      local_178 = local_188;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_120,&local_180);
      psVar5 = &local_188->next;
      local_188 = (local_188->next).
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_180,
                 &(psVar5->
                  super___shared_ptr<supermap::BinaryCollapsingSortedStoragesList<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>,_supermap::Key<30UL>_>::ListNode,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      local_80.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR_append_00125fd8;
      if (local_80.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .storageFile_.super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.
                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                   .storageFile_.
                   super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_80.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      ._vptr_OrderedStorage = (_func_int **)&PTR___cxa_pure_virtual_00126050;
      local_80.
      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .
      super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
      .register_.
      super_StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
      .
      super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
      ._vptr_Cloneable =
           (Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
            )&PTR_clone_00126080;
      if (local_80.
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .
          super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
          .register_.innerRegister_._M_t.
          super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
          .
          super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
           )0x0) {
        (**(code **)((long)*(Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>
                             *)local_80.
                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .
                               super_IndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .
                               super_OrderedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
                               .register_.innerRegister_._M_t.
                               super___uniq_ptr_impl<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_>_>
                               .
                               super__Head_base<0UL,_supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>_*,_false>
                               ._M_head_impl + 0x10))();
      }
    } while (local_188 != (element_type *)0x0);
  }
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
  }
  if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
  }
  return;
}

Assistant:

void append(std::unique_ptr<SortedStorage> &&storage) override {
        head_ = std::make_shared<ListNode>(std::move(storage), std::move(head_), batchSize_);
        std::shared_ptr<ListNode> curNode = head_;
        std::shared_ptr<ListNode> nextNode = curNode->next;
        while (nextNode != nullptr) {
            assert(curNode->getRank() <= nextNode->getRank());
            if (curNode->getRank() < nextNode->getRank()) {
                break;
            }
            assert(curNode->valid());
            assert(nextNode->valid());
            SortedStorage mergedKeys(
                std::vector<SortedStorage>{*nextNode->storage, *curNode->storage},
                "collapse",
                curNode->storage->getFileManager(),
                batchSize_,
                innerRegisterSupplier_
            );
            nextNode->storage->resetWith(std::move(mergedKeys));
            head_ = nextNode;
            curNode = nextNode;
            nextNode = nextNode->next;
        }
    }